

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O2

void * lj_obj_ptr(global_State *g,cTValue *o)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = o->u64;
  lVar2 = (long)uVar1 >> 0x2f;
  if (lVar2 == -4) {
    return (void *)(uVar1 & 0x7fffffffff |
                   (ulong)*(uint *)((g->gc).lightudseg.ptr64 + (uVar1 >> 0x27 & 0xff) * 4) << 0x20);
  }
  if (lVar2 == -0xb) {
    return (void *)((uVar1 & 0x7fffffffffff) + 0x10);
  }
  if (lVar2 == -0xd) {
    return (void *)((uVar1 & 0x7fffffffffff) + 0x30);
  }
  if ((int)((long)uVar1 >> 0x2f) + 0xdU < 9) {
    return (void *)(uVar1 & 0x7fffffffffff);
  }
  return (void *)0x0;
}

Assistant:

const void * LJ_FASTCALL lj_obj_ptr(global_State *g, cTValue *o)
{
  UNUSED(g);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(g, o);
  else if (LJ_HASFFI && tviscdata(o))
    return cdataptr(cdataV(o));
  else if (tvisgcv(o))
    return gcV(o);
  else
    return NULL;
}